

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

CBlockIndex * __thiscall
node::BlockManager::AddToBlockIndex
          (BlockManager *this,CBlockHeader *block,CBlockIndex **best_header)

{
  _Hash_node_base *p_Var1;
  CBlockIndex *pCVar2;
  int i;
  int iVar3;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var4;
  __node_base_ptr p_Var5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  CBlockIndex *pCVar9;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar10;
  CBlockIndex *pindexNew;
  undefined8 local_b8;
  CBlockIndex *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  uint256 local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&local_78,block);
  pVar10 = std::__detail::
           _Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::try_emplace<uint256,CBlockHeader_const&>
                     ((_Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&this->m_block_index,(const_iterator)0x0,&local_78,block);
  _Var4 = pVar10.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
  ;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar9 = (CBlockIndex *)
             ((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28);
    goto LAB_00209971;
  }
  pCVar9 = (CBlockIndex *)
           ((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                  _M_cur + 0x28);
  *(undefined4 *)
   ((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur + 0xb4
   ) = 0;
  *(long *)((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                  _M_cur + 0x28) =
       (long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur + 8
  ;
  uVar7 = *(ulong *)(block->hashPrevBlock).super_base_blob<256U>.m_data._M_elems;
  local_a0 = pCVar9;
  p_Var5 = std::
           _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_block_index)._M_h,uVar7 % (this->m_block_index)._M_h._M_bucket_count
                      ,&block->hashPrevBlock,uVar7);
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var5->_M_nxt, p_Var1 != (_Hash_node_base *)0x0)) {
    *(_Hash_node_base **)
     ((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
     0x30) = p_Var1 + 5;
    *(int *)((long)_Var4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                   _M_cur + 0x40) = *(int *)&p_Var1[8]._M_nxt + 1;
    CBlockIndex::BuildSkip(pCVar9);
    pCVar9 = local_a0;
  }
  pCVar2 = pCVar9->pprev;
  if (pCVar2 == (CBlockIndex *)0x0) {
    pCVar9->nTimeMax = pCVar9->nTime;
    local_b8 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
  }
  else {
    uVar8 = pCVar9->nTime;
    if (pCVar9->nTime < pCVar2->nTimeMax) {
      uVar8 = pCVar2->nTimeMax;
    }
    pCVar9->nTimeMax = uVar8;
    local_b8 = *(undefined8 *)(pCVar2->nChainWork).super_base_uint<256U>.pn;
    local_88 = *(undefined8 *)((pCVar2->nChainWork).super_base_uint<256U>.pn + 6);
    local_98 = *(undefined8 *)((pCVar2->nChainWork).super_base_uint<256U>.pn + 2);
    uStack_90 = *(undefined8 *)((pCVar2->nChainWork).super_base_uint<256U>.pn + 4);
  }
  GetBlockProof((arith_uint256 *)&local_78,pCVar9);
  pCVar9 = local_a0;
  local_58 = local_b8;
  uStack_50 = local_98;
  uStack_48 = uStack_90;
  uStack_40 = local_88;
  lVar6 = 0;
  uVar7 = 0;
  do {
    uVar7 = (ulong)*(uint *)(local_78.super_base_blob<256U>.m_data._M_elems + lVar6 * 4) +
            *(uint *)((long)&local_58 + lVar6 * 4) + uVar7;
    *(int *)((long)&local_58 + lVar6 * 4) = (int)uVar7;
    uVar7 = uVar7 >> 0x20;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  *(undefined8 *)((local_a0->nChainWork).super_base_uint<256U>.pn + 4) = uStack_48;
  *(undefined8 *)((local_a0->nChainWork).super_base_uint<256U>.pn + 6) = uStack_40;
  *(undefined8 *)(local_a0->nChainWork).super_base_uint<256U>.pn = local_58;
  *(undefined8 *)((local_a0->nChainWork).super_base_uint<256U>.pn + 2) = uStack_50;
  if ((local_a0->nStatus & 0x66) == 0) {
    local_a0->nStatus = local_a0->nStatus & 0xffffff98 | 2;
  }
  if (*best_header == (CBlockIndex *)0x0) {
LAB_00209957:
    *best_header = pCVar9;
  }
  else {
    iVar3 = base_uint<256U>::CompareTo
                      (&((*best_header)->nChainWork).super_base_uint<256U>,
                       &(local_a0->nChainWork).super_base_uint<256U>);
    if (iVar3 < 0) goto LAB_00209957;
  }
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
              *)&this->m_dirty_blockindex,&local_a0);
  pCVar9 = local_a0;
LAB_00209971:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar9;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* BlockManager::AddToBlockIndex(const CBlockHeader& block, CBlockIndex*& best_header)
{
    AssertLockHeld(cs_main);

    auto [mi, inserted] = m_block_index.try_emplace(block.GetHash(), block);
    if (!inserted) {
        return &mi->second;
    }
    CBlockIndex* pindexNew = &(*mi).second;

    // We assign the sequence id to blocks only when the full data is available,
    // to avoid miners withholding blocks but broadcasting headers, to get a
    // competitive advantage.
    pindexNew->nSequenceId = 0;

    pindexNew->phashBlock = &((*mi).first);
    BlockMap::iterator miPrev = m_block_index.find(block.hashPrevBlock);
    if (miPrev != m_block_index.end()) {
        pindexNew->pprev = &(*miPrev).second;
        pindexNew->nHeight = pindexNew->pprev->nHeight + 1;
        pindexNew->BuildSkip();
    }
    pindexNew->nTimeMax = (pindexNew->pprev ? std::max(pindexNew->pprev->nTimeMax, pindexNew->nTime) : pindexNew->nTime);
    pindexNew->nChainWork = (pindexNew->pprev ? pindexNew->pprev->nChainWork : 0) + GetBlockProof(*pindexNew);
    pindexNew->RaiseValidity(BLOCK_VALID_TREE);
    if (best_header == nullptr || best_header->nChainWork < pindexNew->nChainWork) {
        best_header = pindexNew;
    }

    m_dirty_blockindex.insert(pindexNew);

    return pindexNew;
}